

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSContext * JS_NewContextRaw(JSRuntime *rt)

{
  JSValue *pJVar1;
  JSRuntime *in_RDI;
  int i;
  JSContext *ctx;
  JSContext *in_stack_00000090;
  JSGCObjectHeader *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  JSRuntime *in_stack_ffffffffffffffa8;
  uint uStack_4c;
  uint uStack_3c;
  uint uStack_2c;
  int local_1c;
  JSContext *local_8;
  
  local_8 = (JSContext *)
            js_mallocz_rt(in_stack_ffffffffffffffa8,
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (local_8 == (JSContext *)0x0) {
    local_8 = (JSContext *)0x0;
  }
  else {
    (local_8->header).ref_count = 1;
    add_gc_object((JSRuntime *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  in_stack_ffffffffffffff98,JS_GC_OBJ_TYPE_JS_OBJECT);
    pJVar1 = (JSValue *)
             js_malloc_rt((JSRuntime *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                          ,(size_t)in_stack_ffffffffffffff98);
    local_8->class_proto = pJVar1;
    if (local_8->class_proto == (JSValue *)0x0) {
      js_free_rt((JSRuntime *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff98);
      local_8 = (JSContext *)0x0;
    }
    else {
      local_8->rt = in_RDI;
      list_add_tail((list_head *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    (list_head *)in_stack_ffffffffffffff98);
      for (local_1c = 0; local_1c < in_RDI->class_count; local_1c = local_1c + 1) {
        pJVar1 = local_8->class_proto;
        pJVar1[local_1c].u.ptr = (void *)((ulong)uStack_2c << 0x20);
        pJVar1[local_1c].tag = 2;
      }
      (local_8->array_ctor).u.ptr = (void *)((ulong)uStack_3c << 0x20);
      (local_8->array_ctor).tag = 2;
      (local_8->regexp_ctor).u.ptr = (void *)((ulong)uStack_4c << 0x20);
      (local_8->regexp_ctor).tag = 2;
      (local_8->promise_ctor).u.ptr = (void *)((ulong)in_stack_ffffffffffffffa4 << 0x20);
      (local_8->promise_ctor).tag = 2;
      init_list_head(&local_8->loaded_modules);
      JS_AddIntrinsicBasicObjects(in_stack_00000090);
    }
  }
  return local_8;
}

Assistant:

JSContext *JS_NewContextRaw(JSRuntime *rt)
{
    JSContext *ctx;
    int i;

    ctx = js_mallocz_rt(rt, sizeof(JSContext));
    if (!ctx)
        return NULL;
    ctx->header.ref_count = 1;
    add_gc_object(rt, &ctx->header, JS_GC_OBJ_TYPE_JS_CONTEXT);

    ctx->class_proto = js_malloc_rt(rt, sizeof(ctx->class_proto[0]) *
                                    rt->class_count);
    if (!ctx->class_proto) {
        js_free_rt(rt, ctx);
        return NULL;
    }
    ctx->rt = rt;
    list_add_tail(&ctx->link, &rt->context_list);
#ifdef CONFIG_BIGNUM
    ctx->bf_ctx = &rt->bf_ctx;
    ctx->fp_env.prec = 113;
    ctx->fp_env.flags = bf_set_exp_bits(15) | BF_RNDN | BF_FLAG_SUBNORMAL;
#endif
    for(i = 0; i < rt->class_count; i++)
        ctx->class_proto[i] = JS_NULL;
    ctx->array_ctor = JS_NULL;
    ctx->regexp_ctor = JS_NULL;
    ctx->promise_ctor = JS_NULL;
    init_list_head(&ctx->loaded_modules);

    JS_AddIntrinsicBasicObjects(ctx);
    return ctx;
}